

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::find_function_local_luts
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler,
          bool single_function)

{
  uint uVar1;
  uint32_t uVar2;
  __node_base_ptr p_Var3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  __node_base_ptr p_Var7;
  size_type sVar8;
  SPIRBlock *block;
  SPIRConstant *pSVar9;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  bool bVar15;
  uint32_t dominator;
  StaticExpressionAccessHandler static_expression_handler;
  DominatorBuilder builder;
  uint local_8c;
  AnalyzeVariableScopeAccessHandler *local_88;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_80;
  OpcodeHandler local_78;
  Compiler *local_70;
  uint32_t local_68;
  undefined8 local_64;
  DominatorBuilder local_58;
  _Hash_node_base *local_48;
  CFG *local_40;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar1 = (entry->super_IVariant).self.id;
  p_Var3 = (this->function_cfgs)._M_h._M_buckets
           [(ulong)uVar1 % (this->function_cfgs)._M_h._M_bucket_count];
  for (p_Var7 = p_Var3->_M_nxt; uVar1 != *(uint *)&p_Var7[1]._M_nxt; p_Var7 = p_Var7->_M_nxt) {
    p_Var3 = p_Var7;
  }
  p_Var13 = (handler->accessed_variables_to_block)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    local_40 = (CFG *)p_Var3->_M_nxt[2]._M_nxt;
    local_38 = &(handler->complete_write_variables_to_block)._M_h;
    local_80 = &(handler->partial_write_variables_to_block)._M_h;
    local_88 = handler;
    do {
      pSVar4 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&p_Var13[1]._M_nxt);
      uVar2 = expression_type_id(this,*(uint32_t *)&p_Var13[1]._M_nxt);
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar2);
      if (pSVar4->is_written_to == false) {
        local_78._vptr_OpcodeHandler._0_4_ = (pSVar4->super_IVariant).self.id;
        sVar6 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(local_38,(key_type_conflict *)&local_78);
        bVar15 = true;
        if (sVar6 == 0) {
          local_58.cfg._0_4_ = (pSVar4->super_IVariant).self.id;
          sVar6 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(local_80,(key_type_conflict *)&local_58);
          bVar15 = sVar6 != 0;
        }
        pSVar4->is_written_to = bVar15;
      }
      if (((pSVar4->storage == Function || pSVar4->storage == Private && single_function) &&
          (pSVar4->phi_variable == false)) &&
         ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
        uVar14 = (ulong)(pSVar4->initializer).id;
        if (uVar14 == 0) {
          local_78._vptr_OpcodeHandler._0_4_ = (pSVar4->super_IVariant).self.id;
          sVar6 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(local_80,(key_type_conflict *)&local_78);
          if (sVar6 == 0) {
            uVar1 = (pSVar4->super_IVariant).self.id;
            uVar14 = (local_88->complete_write_variables_to_block)._M_h._M_bucket_count;
            uVar11 = (ulong)uVar1 % uVar14;
            p_Var3 = (local_88->complete_write_variables_to_block)._M_h._M_buckets[uVar11];
            p_Var7 = (__node_base_ptr)0x0;
            if ((p_Var3 != (__node_base_ptr)0x0) &&
               (p_Var7 = p_Var3, p_Var12 = p_Var3->_M_nxt,
               uVar1 != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
              while (p_Var10 = p_Var12->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
                p_Var7 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar14 != uVar11) ||
                   (p_Var7 = p_Var12, p_Var12 = p_Var10, uVar1 == *(uint *)&p_Var10[1]._M_nxt))
                goto LAB_00398134;
              }
              p_Var7 = (__node_base_ptr)0x0;
            }
LAB_00398134:
            if (p_Var7 == (__node_base_ptr)0x0) {
              p_Var10 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var10 = p_Var7->_M_nxt;
            }
            uVar14 = 0;
            if (p_Var10 == (_Hash_node_base *)0x0) {
LAB_00398238:
              uVar14 = 0;
              bVar15 = false;
            }
            else {
              bVar15 = false;
              if (p_Var10[5]._M_nxt == (_Hash_node_base *)0x1) {
                local_48 = p_Var10;
                DominatorBuilder::DominatorBuilder(&local_58,local_40);
                for (p_Var10 = p_Var13[4]._M_nxt; p_Var10 != (_Hash_node_base *)0x0;
                    p_Var10 = p_Var10->_M_nxt) {
                  DominatorBuilder::add_block(&local_58,*(uint32_t *)&p_Var10[1]._M_nxt);
                }
                local_8c = local_58.dominator;
                sVar8 = ::std::
                        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)(local_48 + 2),&local_8c);
                if (sVar8 == 0) goto LAB_00398238;
                local_68 = (pSVar4->super_IVariant).self.id;
                local_78._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_0050c000;
                local_64 = 0;
                local_70 = this;
                block = Variant::get<spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                   local_8c);
                traverse_all_reachable_opcodes(this,block,&local_78);
                uVar14 = 0;
                bVar15 = false;
                if ((int)local_64 != 0 && local_64._4_4_ == 1) {
                  bVar15 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr
                           [local_64 & 0xffffffff].type == TypeConstant;
                  uVar14 = 0;
                  if (bVar15) {
                    uVar14 = local_64 & 0xffffffff;
                  }
                }
              }
            }
            if (bVar15) goto LAB_0039823e;
          }
        }
        else if (((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[uVar14].type ==
                  TypeConstant) && (pSVar4->is_written_to == false)) {
LAB_0039823e:
          pSVar9 = Variant::get<spirv_cross::SPIRConstant>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar14);
          pSVar9->is_used_as_lut = true;
          (pSVar4->static_expression).id = (uint32_t)uVar14;
          pSVar4->statically_assigned = true;
          pSVar4->remapped_variable = true;
        }
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Compiler::find_function_local_luts(SPIRFunction &entry, const AnalyzeVariableScopeAccessHandler &handler,
                                        bool single_function)
{
	auto &cfg = *function_cfgs.find(entry.self)->second;

	// For each variable which is statically accessed.
	for (auto &accessed_var : handler.accessed_variables_to_block)
	{
		auto &blocks = accessed_var.second;
		auto &var = get<SPIRVariable>(accessed_var.first);
		auto &type = expression_type(accessed_var.first);

		// First check if there are writes to the variable. Later, if there are none, we'll
		// reconsider it as globally accessed LUT.
		if (!var.is_written_to)
		{
			var.is_written_to = handler.complete_write_variables_to_block.count(var.self) != 0 ||
			                    handler.partial_write_variables_to_block.count(var.self) != 0;
		}

		// Only consider function local variables here.
		// If we only have a single function in our CFG, private storage is also fine,
		// since it behaves like a function local variable.
		bool allow_lut = var.storage == StorageClassFunction || (single_function && var.storage == StorageClassPrivate);
		if (!allow_lut)
			continue;

		// We cannot be a phi variable.
		if (var.phi_variable)
			continue;

		// Only consider arrays here.
		if (type.array.empty())
			continue;

		// If the variable has an initializer, make sure it is a constant expression.
		uint32_t static_constant_expression = 0;
		if (var.initializer)
		{
			if (ir.ids[var.initializer].get_type() != TypeConstant)
				continue;
			static_constant_expression = var.initializer;

			// There can be no stores to this variable, we have now proved we have a LUT.
			if (var.is_written_to)
				continue;
		}
		else
		{
			// We can have one, and only one write to the variable, and that write needs to be a constant.

			// No partial writes allowed.
			if (handler.partial_write_variables_to_block.count(var.self) != 0)
				continue;

			auto itr = handler.complete_write_variables_to_block.find(var.self);

			// No writes?
			if (itr == end(handler.complete_write_variables_to_block))
				continue;

			// We write to the variable in more than one block.
			auto &write_blocks = itr->second;
			if (write_blocks.size() != 1)
				continue;

			// The write needs to happen in the dominating block.
			DominatorBuilder builder(cfg);
			for (auto &block : blocks)
				builder.add_block(block);
			uint32_t dominator = builder.get_dominator();

			// The complete write happened in a branch or similar, cannot deduce static expression.
			if (write_blocks.count(dominator) == 0)
				continue;

			// Find the static expression for this variable.
			StaticExpressionAccessHandler static_expression_handler(*this, var.self);
			traverse_all_reachable_opcodes(get<SPIRBlock>(dominator), static_expression_handler);

			// We want one, and exactly one write
			if (static_expression_handler.write_count != 1 || static_expression_handler.static_expression == 0)
				continue;

			// Is it a constant expression?
			if (ir.ids[static_expression_handler.static_expression].get_type() != TypeConstant)
				continue;

			// We found a LUT!
			static_constant_expression = static_expression_handler.static_expression;
		}

		get<SPIRConstant>(static_constant_expression).is_used_as_lut = true;
		var.static_expression = static_constant_expression;
		var.statically_assigned = true;
		var.remapped_variable = true;
	}
}